

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderSubroutineTests.cpp
# Opt level: O2

string * __thiscall
gl4cts::ShaderSubroutine::NegativeTest10::getFragmentShader_abi_cxx11_
          (string *__return_storage_ptr__,NegativeTest10 *this,bool include_duplicate_function)

{
  stringstream result_sstream;
  stringstream local_1a0 [16];
  ostream local_190;
  
  std::__cxx11::stringstream::stringstream(local_1a0);
  std::operator<<(&local_190,
                  "#version 400\n\n#extension GL_ARB_shader_subroutine : require\n\nsubroutine void subroutineType(inout vec4 test);\n\nsubroutine(subroutineType) void test_function(inout vec4 test)\n{\n    test = vec4(2, 3, 4, 5);\n}\n\nsubroutine uniform subroutineType function;\nout vec4 result;\n\n"
                 );
  if (include_duplicate_function) {
    std::operator<<(&local_190,
                    "void test_function(inout vec4 test)\n{\n    test = vec4(3, 4, 5, 6);\n}\n\n");
  }
  std::operator<<(&local_190,"void main()\n{\n    test_function(result);\n}\n");
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

std::string NegativeTest10::getFragmentShader(bool include_duplicate_function)
{
	std::stringstream result_sstream;

	result_sstream << "#version 400\n"
					  "\n"
					  "#extension GL_ARB_shader_subroutine : require\n"
					  "\n"
					  "subroutine void subroutineType(inout vec4 test);\n"
					  "\n"
					  "subroutine(subroutineType) void test_function(inout vec4 test)\n"
					  "{\n"
					  "    test = vec4(2, 3, 4, 5);\n"
					  "}\n"
					  "\n"
					  "subroutine uniform subroutineType function;\n"
					  "out vec4 result;\n"
					  "\n";

	if (include_duplicate_function)
	{
		result_sstream << "void test_function(inout vec4 test)\n"
						  "{\n"
						  "    test = vec4(3, 4, 5, 6);\n"
						  "}\n"
						  "\n";
	}

	result_sstream << "void main()\n"
					  "{\n"
					  "    test_function(result);\n"
					  "}\n";

	return result_sstream.str();
}